

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall
SQVM::NewSlot(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *val,bool bstatic)

{
  SQObjectType SVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  SQChar *pSVar5;
  SQChar *pSVar6;
  SQString *x;
  SQMetaMethod mm;
  SQMetaMethod mm_00;
  char *s;
  SQTable *pSVar7;
  bool bVar8;
  SQObjectPtr closure;
  SQObjectPtr res;
  
  if ((key->super_SQObject)._type == OT_NULL) {
    s = "null cannot be used as index";
LAB_0015bf74:
    bVar8 = false;
    Raise_Error(this,s);
  }
  else {
    SVar1 = (self->super_SQObject)._type;
    if (SVar1 == OT_CLASS) {
      bVar8 = SQClass::NewSlot((self->super_SQObject)._unVal.pClass,this->_sharedstate,key,val,
                               bstatic);
      if (!bVar8) {
        if (((self->super_SQObject)._unVal.pClass)->_locked != true) {
          x = PrintObjVal(this,key);
          SQObjectPtr::SQObjectPtr(&res,x);
          Raise_Error(this,"the property \'%s\' already exists",
                      &(res.super_SQObject._unVal.pTable)->_firstfree);
          goto LAB_0015c1e7;
        }
        s = "trying to modify a class that has already been instantiated";
        goto LAB_0015bf74;
      }
    }
    else if (SVar1 == OT_INSTANCE) {
      res.super_SQObject._type = OT_NULL;
      res.super_SQObject._unVal.pTable = (SQTable *)0x0;
      closure.super_SQObject._type = OT_NULL;
      closure.super_SQObject._unVal.pTable = (SQTable *)0x0;
      pSVar7 = (self->super_SQObject)._unVal.pTable;
      if (((pSVar7->super_SQDelegable)._delegate == (SQTable *)0x0) ||
         (iVar4 = (*(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                    _vptr_SQRefCounted[6])(pSVar7,this,0xd,&closure), (char)iVar4 == '\0')) {
        Raise_Error(this,"class instances do not support the new slot operator");
        SQObjectPtr::~SQObjectPtr(&closure);
LAB_0015c1e7:
        SQObjectPtr::~SQObjectPtr(&res);
        return false;
      }
      Push(this,self);
      Push(this,key);
      Push(this,val);
      bVar8 = CallMetaMethod(this,&closure,mm_00,3,&res);
      SQObjectPtr::~SQObjectPtr(&closure);
      SQObjectPtr::~SQObjectPtr(&res);
      if (!bVar8) {
        return false;
      }
    }
    else {
      if (SVar1 != OT_TABLE) {
        pSVar5 = GetTypeName(self);
        pSVar6 = GetTypeName(key);
        Raise_Error(this,"indexing %s with %s",pSVar5,pSVar6);
        return false;
      }
      pSVar7 = (self->super_SQObject)._unVal.pTable;
      if ((pSVar7->super_SQDelegable)._delegate != (SQTable *)0x0) {
        res.super_SQObject._type = OT_NULL;
        res.super_SQObject._unVal.pTable = (SQTable *)0x0;
        bVar2 = SQTable::Get(pSVar7,key,&res);
        bVar8 = true;
        bVar3 = true;
        if (!bVar2) {
          closure.super_SQObject._type = OT_NULL;
          closure.super_SQObject._unVal.pTable = (SQTable *)0x0;
          pSVar7 = (self->super_SQObject)._unVal.pTable;
          if ((pSVar7->super_SQDelegable)._delegate != (SQTable *)0x0) {
            iVar4 = (*(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                      _vptr_SQRefCounted[6])(pSVar7,this,0xd,&closure);
            bVar3 = true;
            if ((char)iVar4 != '\0') {
              Push(this,self);
              Push(this,key);
              Push(this,val);
              bVar3 = CallMetaMethod(this,&closure,mm,3,&res);
              bVar8 = !bVar3;
            }
          }
          SQObjectPtr::~SQObjectPtr(&closure);
        }
        SQObjectPtr::~SQObjectPtr(&res);
        if (bVar3 == false) {
          return false;
        }
        if (!bVar8) goto LAB_0015c146;
        pSVar7 = (self->super_SQObject)._unVal.pTable;
      }
      SQTable::NewSlot(pSVar7,key,val);
    }
LAB_0015c146:
    bVar8 = true;
  }
  return bVar8;
}

Assistant:

bool SQVM::NewSlot(const SQObjectPtr &self,const SQObjectPtr &key,const SQObjectPtr &val,bool bstatic)
{
    if(sq_type(key) == OT_NULL) { Raise_Error(_SC("null cannot be used as index")); return false; }
    switch(sq_type(self)) {
    case OT_TABLE: {
        bool rawcall = true;
        if(_table(self)->_delegate) {
            SQObjectPtr res;
            if(!_table(self)->Get(key,res)) {
                SQObjectPtr closure;
                if(_delegable(self)->_delegate && _delegable(self)->GetMetaMethod(this,MT_NEWSLOT,closure)) {
                    Push(self);Push(key);Push(val);
                    if(!CallMetaMethod(closure,MT_NEWSLOT,3,res)) {
                        return false;
                    }
                    rawcall = false;
                }
                else {
                    rawcall = true;
                }
            }
        }
        if(rawcall) _table(self)->NewSlot(key,val); //cannot fail

        break;}
    case OT_INSTANCE: {
        SQObjectPtr res;
        SQObjectPtr closure;
        if(_delegable(self)->_delegate && _delegable(self)->GetMetaMethod(this,MT_NEWSLOT,closure)) {
            Push(self);Push(key);Push(val);
            if(!CallMetaMethod(closure,MT_NEWSLOT,3,res)) {
                return false;
            }
            break;
        }
        Raise_Error(_SC("class instances do not support the new slot operator"));
        return false;
        break;}
    case OT_CLASS:
        if(!_class(self)->NewSlot(_ss(this),key,val,bstatic)) {
            if(_class(self)->_locked) {
                Raise_Error(_SC("trying to modify a class that has already been instantiated"));
                return false;
            }
            else {
                SQObjectPtr oval = PrintObjVal(key);
                Raise_Error(_SC("the property '%s' already exists"),_stringval(oval));
                return false;
            }
        }
        break;
    default:
        Raise_Error(_SC("indexing %s with %s"),GetTypeName(self),GetTypeName(key));
        return false;
        break;
    }
    return true;
}